

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O1

size_t file_write(png_t *png,void *p,size_t size,size_t numel)

{
  uint uVar1;
  size_t sVar2;
  undefined4 extraout_var;
  
  if (png->write_fun != (png_write_callback_t)0x0) {
    uVar1 = (*png->write_fun)(p,1,size,(FILE *)png->user_pointer);
    return CONCAT44(extraout_var,uVar1);
  }
  sVar2 = fwrite(p,1,size,(FILE *)png->user_pointer);
  return sVar2;
}

Assistant:

static size_t file_write(png_t* png, void* p, size_t size, size_t numel)
{
	size_t result;

	if(png->write_fun)
	{
		result = png->write_fun(p, size, numel, png->user_pointer);
	}
	else
	{
		result = fwrite(p, size, numel, png->user_pointer);
	}

	return result;
}